

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O3

void __thiscall Start::StartGameNowKeno(Start *this,double *credits,uint *bet)

{
  double dVar1;
  pointer piVar2;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  kenoVector;
  pointer pvVar3;
  pointer pvVar4;
  int iVar5;
  ostream *poVar6;
  char cVar7;
  Keno *this_00;
  pointer pvVar8;
  string p;
  CreditField addCreditBeforeExit;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  Bet settingBet;
  Keno_HotAndCold hotAndCold;
  Keno playgame;
  undefined8 in_stack_ffffffffffffff08;
  char *pcVar9;
  pointer pvVar10;
  char local_e0;
  undefined7 uStack_df;
  CreditField local_d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_c8;
  SelectGame local_a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_88;
  Keno_HotAndCold local_70;
  Keno local_58;
  
  local_c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar9 = &local_e0;
  pvVar10 = (pointer)0x0;
  local_e0 = '\0';
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_88,&local_c8);
  kenoVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar9;
  kenoVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff08;
  kenoVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar10;
  Keno::Keno(&local_58,kenoVector,*credits,(uint)&local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_88);
  Keno_HotAndCold::Keno_HotAndCold(&local_70);
  dVar1 = *credits;
  while (1.0 <= dVar1) {
    if (dVar1 < (double)*bet) {
      *bet = 1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Changing Bet to min: ",0x15);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro!",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "********************************************************************************************************************"
               ,0x74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'p\' to Start a Game!",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'e\' to Change the Bet!",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'i\' to see the Paytable!",0x1e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'c\' to Cashout!",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'a\' to add credit!",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Press \'q\' for More Games!",0x19);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Current Credit: ",0x10);
    poVar6 = std::ostream::_M_insert<double>(*credits);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro!",6);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "********************************************************************************************************************"
               ,0x74);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)&stack0xffffffffffffff10);
    cVar7 = *pcVar9;
    if (pvVar10 == (pointer)0x1 && cVar7 == 'p') {
      iVar5 = system("CLS");
      if (iVar5 != 0) {
        system("clear");
      }
      *credits = *credits - (double)*bet;
      this_00 = &local_58;
      Keno::checkForHits(this_00,credits,bet);
      checkForCreditsAndBet((Start *)this_00,credits,bet);
      outputCreditsAndBetCurrent((Start *)this_00,credits,bet);
      cVar7 = *pcVar9;
    }
    if (pvVar10 == (pointer)0x1 && cVar7 == 'e') {
      iVar5 = system("CLS");
      if (iVar5 != 0) {
        system("clear");
      }
      Bet::Bet((Bet *)&local_a8,*bet,*credits);
      Bet::selectBetKeno((Bet *)&local_a8,bet,credits);
      Bet::~Bet((Bet *)&local_a8);
      cVar7 = *pcVar9;
    }
    if ((cVar7 == 'i') && (pvVar10 == (pointer)0x1)) {
      iVar5 = system("CLS");
      if (iVar5 != 0) {
        system("clear");
      }
      Keno::infoPageKeno(&local_58);
      cVar7 = *pcVar9;
    }
    if ((cVar7 == 'c') && (pvVar10 == (pointer)0x1)) {
      if (*credits <= 0.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Nothing to cashout!",0x13);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cashout...",10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Handpay! Call Attendant! ",0x19);
        poVar6 = std::ostream::_M_insert<double>(*credits);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro!",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        *credits = 0.0;
      }
    }
    cVar7 = *pcVar9;
    if (pvVar10 == (pointer)0x1 && cVar7 == 'g') {
      Gamble::Gamble((Gamble *)&local_a8);
      Gamble::GambleInfoScreen((Gamble *)&local_a8);
      Gamble::~Gamble((Gamble *)&local_a8);
      cVar7 = *pcVar9;
    }
    if (pvVar10 == (pointer)0x1 && cVar7 == 'a') {
      CreditField::CreditField((CreditField *)&local_a8);
      CreditField::AddCredit((CreditField *)&local_a8,credits);
      CreditField::~CreditField((CreditField *)&local_a8);
      cVar7 = *pcVar9;
    }
    if ((cVar7 == 'q') && (pvVar10 == (pointer)0x1)) {
      SelectGame::SelectGame(&local_a8);
      SelectGame::selectGame_Welcome(&local_a8);
      SelectGame::selectGame_Games(&local_a8);
      SelectGame::selectGame_Option(&local_a8,credits);
      SelectGame::~SelectGame(&local_a8);
    }
    if (*credits <= 1.0 && *credits != 1.0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(",0x26);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
      std::ostream::put(-8);
      std::ostream::flush();
      CreditField::CreditField(&local_d0);
      CreditField::AddCredit(&local_d0,credits);
      if (*credits <= 1.0 && *credits != 1.0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"You need to add atleast 1 Euro!",0x1f);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
        std::ostream::put(-8);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cashout: ",9);
        poVar6 = std::ostream::_M_insert<double>(*credits);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," Euro.",6);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        *credits = 0.0;
        SelectGame::SelectGame(&local_a8);
        SelectGame::selectGame_Welcome(&local_a8);
        SelectGame::selectGame_Games(&local_a8);
        SelectGame::selectGame_Option(&local_a8,credits);
        SelectGame::~SelectGame(&local_a8);
      }
      CreditField::~CreditField(&local_d0);
    }
    pvVar4 = local_c8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = local_c8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pvVar8 = local_c8.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_c8.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_c8.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        piVar2 = (pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (piVar2 != (pointer)0x0) {
          operator_delete(piVar2,(long)(pvVar8->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)piVar2);
        }
        pvVar8 = pvVar8 + 1;
      } while (pvVar8 != pvVar4);
      local_c8.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar3;
    }
    dVar1 = *credits;
  }
  Keno_HotAndCold::~Keno_HotAndCold(&local_70);
  Keno::~Keno(&local_58);
  if (pcVar9 != &local_e0) {
    operator_delete(pcVar9,CONCAT71(uStack_df,local_e0) + 1);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_c8);
  return;
}

Assistant:

void Start::StartGameNowKeno(double& credits, unsigned int& bet) {

	std::vector<std::vector<int>>myVectorInStart;
	//myVectorInStart = getVectorMatrix();
	std::string p;
	Keno playgame(myVectorInStart,credits,bet);
	unsigned int minBet = 1;
	Keno_HotAndCold hotAndCold;
	//PaytableSuperFire paytableForGame(myVectorInStart, credits, bet);
	while (credits >= 1) {
		if (credits < bet && credits >= 1) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet << " Euro!" << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		std::cout << "Press 'p' to Start a Game!" << std::endl;
		std::cout << "Press 'e' to Change the Bet!" << std::endl;
		std::cout << "Press 'i' to see the Paytable!" << std::endl;
		std::cout << "Press 'c' to Cashout!" << std::endl;
		std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
		std::cout << "Press 'a' to add credit!" << std::endl;
		std::cout << "Press 'q' for More Games!" << std::endl;
		//std::cout << "Press 'h' for Hot and Cold Numbers!" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "********************************************************************************************************************" << std::endl;

		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size() == 1) {
			//clears screen
			if (system("CLS")) system("clear");
			
			takeCreditsWithBet(credits, bet);
			playgame.checkForHits(credits,bet);
			//RandomNumbersInMatrix(myVectorInStart);
			//std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			//outPutMatrix(myVectorInStart);
			//std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBet(credits, bet);
			outputCreditsAndBetCurrent(credits, bet);
			//paytableForGame.PaytableSuperFireWin(myVectorInStart, credits, bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBetKeno(bet, credits);
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			playgame.infoPageKeno();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {

			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' && p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
		/*if (p[0] == 'h' && p.size() == 1) {
			if (system("CLS")) system("clear");
			hotAndCold.infoHotAndCold();
		}*/
		if (credits < 1) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 1 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}

		myVectorInStart.clear();
	}
}